

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O1

void sect_StartUnion(void)

{
  undefined8 in_RAX;
  UnionStackEntry *pUVar1;
  int *piVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *pcVar3;
  
  if (currentSection == (Section *)0x0) {
    pcVar3 = "UNIONs must be inside a SECTION\n";
  }
  else {
    if (currentSection->type == SECTTYPE_INVALID) {
      __assert_fail("type != SECTTYPE_INVALID",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                    ,0x65,"bool sect_HasData(enum SectionType)");
    }
    if ((currentSection->type & ~SECTTYPE_VRAM) != SECTTYPE_ROMX) {
      pUVar1 = (UnionStackEntry *)malloc(0x10);
      if (pUVar1 != (UnionStackEntry *)0x0) {
        pUVar1->start = curOffset;
        pUVar1->size = 0;
        pUVar1->next = unionStack;
        unionStack = pUVar1;
        return;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fatalerror("Failed to allocate new union stack entry: %s\n",pcVar3);
    }
    pcVar3 = "Cannot use UNION inside of ROM0 or ROMX sections\n";
  }
  error(pcVar3,in_RSI,in_RDX,in_RAX);
  return;
}

Assistant:

void sect_StartUnion(void)
{
	// Important info: currently, UNION and LOAD cannot interact, since UNION is prohibited in
	// "code" sections, whereas LOAD is restricted to them.
	// Therefore, any interactions are NOT TESTED, so lift either of those restrictions at
	// your own peril! ^^

	if (!currentSection) {
		error("UNIONs must be inside a SECTION\n");
		return;
	}
	if (sect_HasData(currentSection->type)) {
		error("Cannot use UNION inside of ROM0 or ROMX sections\n");
		return;
	}
	struct UnionStackEntry *entry = (struct UnionStackEntry *)malloc(sizeof(*entry));

	if (!entry)
		fatalerror("Failed to allocate new union stack entry: %s\n", strerror(errno));
	entry->start = curOffset;
	entry->size = 0;
	entry->next = unionStack;
	unionStack = entry;
}